

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::CountOnesFunction::eval
          (CountOnesFunction *this,EvalContext *context,Args *args,SourceRange range,
          SystemCallInfo *param_5)

{
  SourceRange sourceRange;
  bool bVar1;
  bitwidth_t bVar2;
  ConstantValue *this_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  ConstantValue *in_RDI;
  SourceLocation in_R8;
  uint64_t count;
  SVInt *iv;
  ConstantValue value;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  EvalContext *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  bitwidth_t bits;
  ConstantValue *this_01;
  EvalContext *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  SourceLocation in_stack_ffffffffffffff60;
  
  this_01 = in_RDI;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::eval((Expression *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                   in_stack_ffffffffffffff10);
  sourceRange.endLoc = in_R8;
  sourceRange.startLoc = in_stack_ffffffffffffff60;
  Bitstream::convertToBitVector
            ((ConstantValue *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             sourceRange,in_stack_ffffffffffffff50);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x94aeb4);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x94aec1);
  bits = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff1c);
  if (bVar1) {
    this_00 = (ConstantValue *)slang::ConstantValue::integer((ConstantValue *)0x94af2b);
    bVar2 = SVInt::countOnes((SVInt *)this_01);
    SVInt::SVInt((SVInt *)in_RDI,bits,(uint64_t)this_00,SUB41(bVar2 >> 0x18,0));
    slang::ConstantValue::ConstantValue(this_00,(SVInt *)CONCAT44(bVar2,in_stack_ffffffffffffff08));
    SVInt::~SVInt((SVInt *)in_RDI);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_ffffffffffffff10,
               (nullptr_t)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x94afbe);
  return this_01;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange range,
                       const CallExpression::SystemCallInfo&) const final {
        auto value = Bitstream::convertToBitVector(args[0]->eval(context), range, context);
        if (!value)
            return nullptr;

        const SVInt& iv = value.integer();
        uint64_t count = iv.countOnes();
        return SVInt(32, count, true);
    }